

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool Dump3dmChunk_EndReadChunkHelper
               (ON_BinaryArchive *file,ON__UINT64 offset0,ON__UINT32 tcode,ON__INT64 big_value,
               ON_TextLog *dump)

{
  bool bVar1;
  char *msg;
  ON__UINT64 offset;
  
  offset = file->m_current_positionX;
  bVar1 = ON_BinaryArchive::EndRead3dmChunk(file);
  if (bVar1) {
    if ((int)tcode < 0) {
      return true;
    }
    if (-1 < (long)(((big_value + offset0) - (offset + (tcode >> 0xd & 4))) +
                    (ulong)(0x31 < file->m_3dm_version) * 4 + 8)) {
      return true;
    }
    msg = "Read beyond end of chunk.";
    offset = offset0;
  }
  else {
    msg = "EndRead3dmChunk() failed.";
  }
  Dump3dmChunk_ErrorReportHelper(offset,msg,dump);
  return false;
}

Assistant:

static
bool Dump3dmChunk_EndReadChunkHelper( ON_BinaryArchive& file, ON__UINT64 offset0, ON__UINT32 tcode, ON__INT64 big_value, ON_TextLog& dump )
{
  const bool bShortChunk = (0 != (tcode & TCODE_SHORT));
  const ON__UINT64 offset1 = file.CurrentPosition();
  bool rc = file.EndRead3dmChunk();
  if ( !rc ) 
  {
    Dump3dmChunk_ErrorReportHelper(offset1,"EndRead3dmChunk() failed.",dump);
  }
  else if (!bShortChunk) 
  {
    // The crc is read or skipped by the EndRead3dmChunk() call.
    // "extra" is the number of bytes we did not parse in the dump.
    ON__INT64 sizeof_crc = (0 != (TCODE_CRC & tcode)) ? 4 : 0;
    ON__INT64 sizeof_chunk_header = 4+file.SizeofChunkLength();
    ON__INT64 delta =  (offset1 > offset0)
              ?  ((ON__INT64)(offset1 - offset0))
              : -((ON__INT64)(offset0 - offset1));
    const ON__INT64 extra = big_value - (delta+sizeof_crc-sizeof_chunk_header);
    if ( extra < 0 ) 
    {
      Dump3dmChunk_ErrorReportHelper(offset0,"Read beyond end of chunk.",dump);
      rc = false;
    }
  }
  return rc;
}